

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::Dump
          (CordRepBtree *this,CordRep *rep,string_view label,bool include_contents,ostream *stream)

{
  ostream *__os;
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  undefined7 in_register_00000081;
  ostream *stream_local;
  bool include_contents_local;
  CordRep *rep_local;
  string_view label_local;
  
  label_local._M_len = label._M_len;
  __os = (ostream *)CONCAT71(in_register_00000081,include_contents);
  rep_local = rep;
  std::operator<<(__os,"===================================\n");
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rep_local);
  if (!bVar1) {
    __str._M_str = (char *)label_local._M_len;
    __str._M_len = (size_t)rep_local;
    pbVar2 = std::operator<<(__os,__str);
    std::operator<<(pbVar2,'\n');
    std::operator<<(__os,"-----------------------------------\n");
  }
  if (this == (CordRepBtree *)0x0) {
    std::operator<<(__os,"NULL\n");
  }
  else {
    anon_unknown_0::DumpAll(&this->super_CordRep,(bool)((byte)label._M_str & 1),__os,0);
  }
  return;
}

Assistant:

void CordRepBtree::Dump(const CordRep* rep, absl::string_view label,
                        bool include_contents, std::ostream& stream) {
  stream << "===================================\n";
  if (!label.empty()) {
    stream << label << '\n';
    stream << "-----------------------------------\n";
  }
  if (rep) {
    DumpAll(rep, include_contents, stream);
  } else {
    stream << "NULL\n";
  }
}